

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_event.hpp
# Opt level: O0

bool __thiscall
asio::detail::posix_event::
maybe_unlock_and_signal_one<asio::detail::scoped_lock<asio::detail::posix_mutex>>
          (posix_event *this,scoped_lock<asio::detail::posix_mutex> *lock)

{
  ulong uVar1;
  bool bVar2;
  scoped_lock<asio::detail::posix_mutex> *in_RSI;
  pthread_cond_t *in_RDI;
  
  bVar2 = scoped_lock<asio::detail::posix_mutex>::locked(in_RSI);
  if (bVar2) {
    in_RDI[1].__align = in_RDI[1].__align | 1;
    uVar1 = in_RDI[1].__align;
    if (1 < uVar1) {
      scoped_lock<asio::detail::posix_mutex>::unlock
                ((scoped_lock<asio::detail::posix_mutex> *)&in_RDI->__data);
      pthread_cond_signal(in_RDI);
    }
    return 1 < uVar1;
  }
  __assert_fail("lock.locked()",
                "/workspace/llm4binary/github/license_c_cmakelists/catid[P]mau/thirdparty/asio/detail/posix_event.hpp"
                ,0x4d,
                "bool asio::detail::posix_event::maybe_unlock_and_signal_one(Lock &) [Lock = asio::detail::scoped_lock<asio::detail::posix_mutex>]"
               );
}

Assistant:

bool maybe_unlock_and_signal_one(Lock& lock)
  {
    ASIO_ASSERT(lock.locked());
    state_ |= 1;
    if (state_ > 1)
    {
      lock.unlock();
      ::pthread_cond_signal(&cond_); // Ignore EINVAL.
      return true;
    }
    return false;
  }